

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O1

DequeueStatus __thiscall
tracy::Profiler::DequeueContextSwitches(Profiler *this,ConsumerToken *token,int64_t *timeStop)

{
  ConcurrentQueueProducerTypelessBase *pCVar1;
  ProducerBase *pPVar2;
  uint uVar3;
  uint32_t uVar4;
  DequeueStatus DVar5;
  size_t sVar6;
  ConcurrentQueueProducerTypelessBase *pCVar7;
  ProducerBase *pPVar8;
  uint uVar9;
  int iVar10;
  size_t unaff_RBP;
  DequeueStatus DVar11;
  uint32_t *puVar12;
  ConcurrentQueueProducerTypelessBase *pCVar13;
  ProducerBase *pPVar14;
  bool bVar15;
  
  uVar4 = DAT_00978444;
  uVar3 = DAT_00978418;
  pPVar2 = s_queue;
  if ((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
     (token->lastKnownGlobalOffset != DAT_00978444)) {
    if (s_queue == (ProducerBase *)0x0 &&
        token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
      bVar15 = false;
      goto LAB_0038d11a;
    }
    if (token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
      uVar9 = token->initialOffset % DAT_00978418;
      pCVar7 = (ConcurrentQueueProducerTypelessBase *)(s_queue + 8);
      if (s_queue == (ProducerBase *)0x0) {
        pCVar7 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
      token->desiredProducer = pCVar7;
      iVar10 = ~uVar9 + uVar3;
      pCVar13 = pCVar7;
      if (iVar10 != 0) {
        do {
          pCVar1 = pCVar13->next;
          puVar12 = &pCVar1[-1].threadId;
          if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            puVar12 = (uint32_t *)0x0;
          }
          pCVar13 = (ConcurrentQueueProducerTypelessBase *)(puVar12 + 2);
          if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            pCVar13 = pCVar7;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        token->desiredProducer = pCVar13;
      }
    }
    uVar9 = uVar4 - token->lastKnownGlobalOffset;
    if (uVar3 <= uVar9) {
      uVar9 = uVar9 % uVar3;
    }
    if (uVar9 != 0) {
      pCVar7 = (ConcurrentQueueProducerTypelessBase *)(pPVar2 + 8);
      pCVar13 = token->desiredProducer;
      if (pPVar2 == (ProducerBase *)0x0) {
        pCVar7 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
      do {
        pCVar1 = pCVar13->next;
        puVar12 = &pCVar1[-1].threadId;
        if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          puVar12 = (uint32_t *)0x0;
        }
        pCVar13 = (ConcurrentQueueProducerTypelessBase *)(puVar12 + 2);
        if (pCVar1 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pCVar13 = pCVar7;
        }
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      token->desiredProducer = pCVar13;
    }
    token->lastKnownGlobalOffset = uVar4;
    token->currentProducer = token->desiredProducer;
    token->itemsConsumedFromCurrent = 0;
  }
  sVar6 = moodycamel::
          ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
          ProducerBase::
          dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                    ((ProducerBase *)&token->currentProducer[-1].threadId,this,timeStop);
  token->itemsConsumedFromCurrent = token->itemsConsumedFromCurrent + (int)sVar6;
  pPVar2 = s_queue;
  pCVar7 = token->currentProducer->next;
  pPVar14 = (ProducerBase *)&pCVar7[-1].threadId;
  if (pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
    pPVar14 = s_queue;
  }
  if (sVar6 == 0) {
    do {
      pPVar8 = (ProducerBase *)&token->currentProducer[-1].threadId;
      if (token->currentProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pPVar8 = (ProducerBase *)0x0;
      }
      if (pPVar14 == pPVar8) {
        unaff_RBP = 0;
        break;
      }
      sVar6 = moodycamel::
              ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              ProducerBase::
              dequeue_bulk<tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__0,tracy::Profiler::DequeueContextSwitches(tracy::moodycamel::ConsumerToken&,long&)::__1>
                        (pPVar14,this,timeStop);
      if (sVar6 == 0) {
        pCVar7 = ((ConcurrentQueueProducerTypelessBase *)(pPVar14 + 8))->next;
        pPVar14 = (ProducerBase *)&pCVar7[-1].threadId;
        if (pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pPVar14 = pPVar2;
        }
      }
      else {
        token->currentProducer = (ConcurrentQueueProducerTypelessBase *)(pPVar14 + 8);
        token->itemsConsumedFromCurrent = (uint32_t)sVar6;
        unaff_RBP = sVar6;
      }
    } while (sVar6 == 0);
    bVar15 = unaff_RBP != 0;
  }
  else {
    pCVar7 = (ConcurrentQueueProducerTypelessBase *)(pPVar14 + 8);
    if (pPVar14 == (ProducerBase *)0x0) {
      pCVar7 = (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    token->currentProducer = pCVar7;
    token->itemsConsumedFromCurrent = 0;
    bVar15 = true;
  }
LAB_0038d11a:
  DVar11 = DataDequeued;
  if (!bVar15) {
    DVar11 = (uint)(*timeStop != -1) * 2;
  }
  DVar5 = ConnectionLost;
  if (*timeStop != -2) {
    DVar5 = DVar11;
  }
  return DVar5;
}

Assistant:

Profiler::DequeueStatus Profiler::DequeueContextSwitches( tracy::moodycamel::ConsumerToken& token, int64_t& timeStop )
{
    const auto sz = GetQueue().try_dequeue_bulk_single( token, [] ( const uint64_t& ) {},
        [this, &timeStop] ( QueueItem* item, size_t sz )
        {
            assert( sz > 0 );
            int64_t refCtx = m_refTimeCtx;
            while( sz-- > 0 )
            {
                FreeAssociatedMemory( *item );
                if( timeStop < 0 ) return;
                const auto idx = MemRead<uint8_t>( &item->hdr.idx );
                if( idx == (uint8_t)QueueType::ContextSwitch )
                {
                    const auto csTime = MemRead<int64_t>( &item->contextSwitch.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->contextSwitch.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ContextSwitch] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                else if( idx == (uint8_t)QueueType::ThreadWakeup )
                {
                    const auto csTime = MemRead<int64_t>( &item->threadWakeup.time );
                    if( csTime > timeStop )
                    {
                        timeStop = -1;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                    int64_t dt = csTime - refCtx;
                    refCtx = csTime;
                    MemWrite( &item->threadWakeup.time, dt );
                    if( !AppendData( item, QueueDataSize[(int)QueueType::ThreadWakeup] ) )
                    {
                        timeStop = -2;
                        m_refTimeCtx = refCtx;
                        return;
                    }
                }
                item++;
            }
            m_refTimeCtx = refCtx;
        }
    );

    if( timeStop == -2 ) return DequeueStatus::ConnectionLost;
    return ( timeStop == -1 || sz > 0 ) ? DequeueStatus::DataDequeued : DequeueStatus::QueueEmpty;
}